

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_format.hpp
# Opt level: O3

void lightconf::config_format::write_group(scanner *sc,writer *wr,bool braces,group *gr)

{
  char *pcVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  pointer pbVar7;
  pointer ptVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  pointer pcVar9;
  undefined4 uVar12;
  undefined4 uVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  pointer ptVar17;
  int iVar18;
  ulong uVar19;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  size_type sVar20;
  return_type<lightconf::value> pvVar21;
  uint uVar22;
  undefined7 in_register_00000011;
  bool bVar23;
  ulong uVar24;
  _Alloc_hider _Var25;
  pointer pbVar26;
  group *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  writer *this;
  scanner dummy_scanner;
  string key_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  undefined1 local_1e8 [8];
  char *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  vector<lightconf::token,_std::allocator<lightconf::token>_> local_1c8;
  uint uStack_1b0;
  undefined4 local_1ac;
  undefined8 local_1a8;
  int local_1a0;
  _Any_data local_198;
  _Manager_type local_188;
  _Invoker_type p_Stack_180;
  int local_178;
  writer *local_170;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  int local_148;
  double local_140;
  uint uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 local_12c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  undefined1 local_108 [40];
  scanner *local_e0;
  group *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  value local_c8;
  
  bVar14 = true;
  if ((int)CONCAT71(in_register_00000011,braces) != 0) {
    iVar18 = group_length(gr,0x78);
    iVar2 = wr->wrap_length;
    bVar14 = iVar2 < iVar18;
    local_1e8 = (undefined1  [8])&local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"{ ","");
    std::__cxx11::string::_M_append((char *)wr,(ulong)local_1e8);
    wr->col = wr->col + (int)local_1e0;
    if (local_1e8 != (undefined1  [8])&local_1d8) {
      operator_delete((void *)local_1e8);
    }
    writer::indent(wr);
    if (iVar2 < iVar18) {
      writer::newline(wr);
    }
    scanner::expect(sc,'{',false);
  }
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar26 = (gr->order_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = (gr->order_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_170 = wr;
  if (pbVar26 != pbVar7) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_128,pbVar26);
      pbVar26 = pbVar26 + 1;
    } while (pbVar26 != pbVar7);
  }
  pcVar1 = local_1d8._M_local_buf + 8;
  local_e0 = sc;
  local_d8 = gr;
  do {
    uVar22 = sc->cur_token_;
    ptVar8 = (sc->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar19 = (long)(sc->tokens_).
                   super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)ptVar8 >> 6;
    do {
      uVar24 = (ulong)uVar22;
      if (uVar19 <= uVar24) break;
      uVar22 = uVar22 + 1;
    } while (ptVar8[uVar24].type - whitespace_token < 2);
    local_1e0 = pcVar1;
    if (uVar19 == uVar24) {
      local_1e8._0_4_ = 7;
      bVar23 = false;
      local_1d8._M_allocated_capacity = 0;
      local_1d8._M_local_buf[8] = '\0';
      local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffff00;
      local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uStack_1b0 = 0;
      local_1ac._0_1_ = false;
      local_1ac._1_3_ = 0;
    }
    else {
      local_1e8._0_4_ = ptVar8[uVar24].type;
      pcVar9 = ptVar8[uVar24].string_value._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,pcVar9,pcVar9 + ptVar8[uVar24].string_value._M_string_length);
      uVar3 = ptVar8[uVar24].line;
      uVar10 = ptVar8[uVar24].col;
      local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)&ptVar8[uVar24].number_value;
      local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           *(undefined4 *)((long)&ptVar8[uVar24].number_value + 4);
      local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = *(uint *)&ptVar8[uVar24].char_value;
      local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = ptVar8[uVar24].pos;
      bVar23 = local_1e8._0_4_ != 7;
      uStack_1b0 = uVar3;
      local_1ac = uVar10;
      if (bVar23 && braces) {
        uVar22 = sc->cur_token_;
        ptVar8 = (sc->tokens_).
                 super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar19 = (long)(sc->tokens_).
                       super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)ptVar8 >> 6;
        do {
          uVar24 = (ulong)uVar22;
          if (uVar19 <= uVar24) break;
          uVar22 = uVar22 + 1;
        } while (ptVar8[uVar24].type - whitespace_token < 2);
        if (uVar19 == uVar24) {
          local_168._0_4_ = 7;
          local_168._8_8_ = local_158._M_local_buf + 8;
          local_158._M_allocated_capacity = 0;
          local_158._M_local_buf[8] = '\0';
          local_140 = 0.0;
          uStack_138 = uStack_138 & 0xffffff00;
          uStack_134 = 0;
          uStack_130 = 0;
          local_12c = 0;
          bVar23 = true;
        }
        else {
          local_168._0_4_ = ptVar8[uVar24].type;
          local_168._8_8_ = local_158._M_local_buf + 8;
          pcVar9 = ptVar8[uVar24].string_value._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_168 + 8),pcVar9,
                     pcVar9 + ptVar8[uVar24].string_value._M_string_length);
          uVar4 = ptVar8[uVar24].line;
          uVar11 = ptVar8[uVar24].col;
          local_140 = ptVar8[uVar24].number_value;
          ptVar8 = ptVar8 + uVar24;
          uVar15._0_1_ = ptVar8->char_value;
          uVar15._1_3_ = *(undefined3 *)&ptVar8->field_0x31;
          uVar15._4_4_ = ptVar8->pos;
          uStack_138 = (uint)uVar15;
          bVar23 = (undefined1)uVar15 != '}' || local_168._0_4_ != 4;
          uStack_134 = uVar15._4_4_;
          uStack_130 = uVar4;
          local_12c = uVar11;
        }
        if ((char *)local_168._8_8_ != local_158._M_local_buf + 8) {
          operator_delete((void *)local_168._8_8_);
        }
      }
    }
    this = local_170;
    if (local_1e0 != pcVar1) {
      operator_delete(local_1e0);
    }
    if (!bVar23) break;
    scanner::expect_identifier_abi_cxx11_((string *)local_168,sc);
    scanner::expect(sc,'=',false);
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           (local_128.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            local_128.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,local_168);
    if (__position._M_current ==
        local_128.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      read_value(&local_c8,sc);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8.group_value_.order_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
                   *)&local_c8.group_value_);
      std::vector<lightconf::value,_std::allocator<lightconf::value>_>::~vector
                (&local_c8.vector_value_);
      _Var25._M_p = local_c8.string_value_._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.string_value_._M_dataplus._M_p != &local_c8.string_value_.field_2)
      goto LAB_0011332f;
    }
    else {
      std::__cxx11::string::_M_append((char *)this,local_168._0_8_);
      this->col = this->col + local_168._8_4_;
      local_1e8 = (undefined1  [8])&local_1d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8," = ","");
      std::__cxx11::string::_M_append((char *)this,(ulong)local_1e8);
      this->col = this->col + (int)local_1e0;
      if (local_1e8 != (undefined1  [8])&local_1d8) {
        operator_delete((void *)local_1e8);
      }
      local_108._0_8_ = (pointer)0x0;
      local_108._8_8_ = (pointer)0x0;
      local_108._16_8_ = (pointer)0x0;
      if ((__position._M_current)->_M_string_length != 0) {
        uVar19 = 0;
        do {
          sVar20 = std::__cxx11::string::find((char)__position._M_current,0x2e);
          if (sVar20 == 0xffffffffffffffff) {
            sVar20 = (__position._M_current)->_M_string_length;
          }
          pcVar9 = ((__position._M_current)->_M_dataplus)._M_p;
          local_1e8 = (undefined1  [8])&local_1d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1e8,pcVar9 + uVar19,pcVar9 + sVar20);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_108,(value_type *)local_1e8);
          if (local_1e8 != (undefined1  [8])&local_1d8) {
            operator_delete((void *)local_1e8);
          }
          uVar19 = sVar20 + 1;
        } while (uVar19 < (__position._M_current)->_M_string_length);
      }
      pvVar21 = group::get<lightconf::value>(local_d8,(path *)local_108);
      sc = local_e0;
      write_value(local_e0,local_170,pvVar21);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&local_128,(iterator)__position._M_current);
      uVar22 = sc->cur_token_;
      ptVar8 = (sc->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar19 = (long)(sc->tokens_).
                     super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)ptVar8 >> 6;
      do {
        uVar24 = (ulong)uVar22;
        if (uVar19 <= uVar24) break;
        uVar22 = uVar22 + 1;
      } while (ptVar8[uVar24].type - whitespace_token < 2);
      if (uVar19 == uVar24) {
        local_1e8._0_4_ = 7;
        local_1d8._M_allocated_capacity = 0;
        local_1d8._M_local_buf[8] = '\0';
        local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = 0;
        local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffff00;
        local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        uStack_1b0 = 0;
        local_1ac._0_1_ = false;
        local_1ac._1_3_ = 0;
        local_1e0 = pcVar1;
LAB_001131a6:
        if (local_1e0 != pcVar1) {
          operator_delete(local_1e0);
        }
LAB_001131c2:
        this = local_170;
        if (bVar14) {
          writer::newline(local_170);
          goto LAB_00113334;
        }
        local_1e8 = (undefined1  [8])&local_1d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,", ","");
        std::__cxx11::string::_M_append((char *)this,(ulong)local_1e8);
      }
      else {
        local_1e8._0_4_ = ptVar8[uVar24].type;
        pcVar9 = ptVar8[uVar24].string_value._M_dataplus._M_p;
        local_1e0 = pcVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e0,pcVar9,pcVar9 + ptVar8[uVar24].string_value._M_string_length
                  );
        pbVar7 = local_128.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar26 = local_128.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = ptVar8[uVar24].line;
        uVar12 = ptVar8[uVar24].col;
        local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)&ptVar8[uVar24].number_value;
        local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ =
             *(undefined4 *)((long)&ptVar8[uVar24].number_value + 4);
        local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = *(uint *)&ptVar8[uVar24].char_value;
        local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = ptVar8[uVar24].pos;
        uStack_1b0 = uVar5;
        local_1ac = uVar12;
        if ((local_1e8._0_4_ != 4) ||
           ((char)local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage != '}')) goto LAB_001131a6;
        if (local_1e0 != pcVar1) {
          operator_delete(local_1e0);
        }
        this = local_170;
        if (pbVar26 != pbVar7) goto LAB_001131c2;
        if (bVar14) goto LAB_00113334;
        local_1e8 = (undefined1  [8])&local_1d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8," ","");
        std::__cxx11::string::_M_append((char *)this,(ulong)local_1e8);
      }
      this->col = this->col + (int)local_1e0;
      _Var25._M_p = (pointer)local_1e8;
      if (local_1e8 != (undefined1  [8])&local_1d8) {
LAB_0011332f:
        operator_delete(_Var25._M_p);
      }
    }
LAB_00113334:
    scanner::expect(sc,',',true);
    if (braces) {
      uVar22 = sc->cur_token_;
      ptVar8 = (sc->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar19 = (long)(sc->tokens_).
                     super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)ptVar8 >> 6;
      do {
        uVar24 = (ulong)uVar22;
        if (uVar19 <= uVar24) break;
        uVar22 = uVar22 + 1;
      } while (ptVar8[uVar24].type - whitespace_token < 2);
      if (uVar19 == uVar24) {
        local_1e8._0_4_ = 7;
        bVar23 = false;
        local_1d8._M_allocated_capacity = 0;
        local_1d8._M_local_buf[8] = '\0';
        local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = 0;
        local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffff00;
        local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        uStack_1b0 = 0;
        local_1ac._0_1_ = false;
        local_1ac._1_3_ = 0;
        local_1e0 = pcVar1;
      }
      else {
        local_1e8._0_4_ = ptVar8[uVar24].type;
        pcVar9 = ptVar8[uVar24].string_value._M_dataplus._M_p;
        local_1e0 = pcVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e0,pcVar9,pcVar9 + ptVar8[uVar24].string_value._M_string_length
                  );
        uVar6 = ptVar8[uVar24].line;
        uVar13 = ptVar8[uVar24].col;
        ptVar17 = ptVar8 + uVar24;
        uVar16._0_1_ = ptVar17->char_value;
        uVar16._1_3_ = *(undefined3 *)&ptVar17->field_0x31;
        uVar16._4_4_ = ptVar17->pos;
        local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = SUB84(ptVar8[uVar24].number_value,0);
        local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ =
             (undefined4)((ulong)ptVar8[uVar24].number_value >> 0x20);
        local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = (uint)uVar16;
        bVar23 = (undefined1)uVar16 == '}' && local_1e8._0_4_ == 4;
        local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = uVar16._4_4_;
        uStack_1b0 = uVar6;
        local_1ac = uVar13;
      }
      this = local_170;
      if (local_1e0 != pcVar1) {
        operator_delete(local_1e0);
      }
    }
    else {
      bVar23 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._0_8_ != &local_158) {
      operator_delete((void *)local_168._0_8_);
    }
  } while (!bVar23);
  local_d0 = local_128.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar19 = 0;
    pbVar26 = local_128.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__cxx11::string::_M_append((char *)this,(ulong)(pbVar26->_M_dataplus)._M_p);
      this->col = this->col + (int)pbVar26->_M_string_length;
      local_1e8 = (undefined1  [8])&local_1d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8," = ","");
      std::__cxx11::string::_M_append((char *)this,(ulong)local_1e8);
      this->col = this->col + (int)local_1e0;
      if (local_1e8 != (undefined1  [8])&local_1d8) {
        operator_delete((void *)local_1e8);
      }
      local_108._0_8_ = (pointer)(local_108 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"0","");
      local_1e8 = (undefined1  [8])&local_1d8;
      local_1e0 = (char *)0x0;
      local_1d8._M_allocated_capacity = local_1d8._M_allocated_capacity & 0xffffffffffffff00;
      local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uStack_1b0 = 0;
      local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      local_1c8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      local_1ac._0_1_ = true;
      local_1a8._0_4_ = 0;
      local_1a8._4_4_ = 1;
      local_1a0 = 1;
      local_188 = (_Manager_type)0x0;
      p_Stack_180 = (_Invoker_type)0x0;
      local_198._M_unused._M_object = (void *)0x0;
      local_198._8_8_ = 0;
      local_178 = 0;
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)local_168,
                 (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)default_scanner_params);
      local_148 = default_scanner_params._32_4_;
      scanner::scan((scanner *)local_1e8,(string *)local_108,(scanner_params *)local_168);
      if ((code *)local_158._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_158._M_allocated_capacity)
                  ((scanner_params *)local_168,(scanner_params *)local_168,3);
      }
      if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_);
      }
      local_108._0_8_ = (pointer)0x0;
      local_108._8_8_ = (pointer)0x0;
      local_108._16_8_ = (pointer)0x0;
      if (pbVar26->_M_string_length != 0) {
        uVar24 = 0;
        do {
          sVar20 = std::__cxx11::string::find((char)pbVar26,0x2e);
          if (sVar20 == 0xffffffffffffffff) {
            sVar20 = pbVar26->_M_string_length;
          }
          pcVar9 = (pbVar26->_M_dataplus)._M_p;
          local_168._0_8_ = &local_158;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_168,pcVar9 + uVar24,pcVar9 + sVar20);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_108,(value_type *)local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._0_8_ != &local_158) {
            operator_delete((void *)local_168._0_8_);
          }
          uVar24 = sVar20 + 1;
        } while (uVar24 < pbVar26->_M_string_length);
      }
      pvVar21 = group::get<lightconf::value>(local_d8,(path *)local_108);
      this = local_170;
      write_value((scanner *)local_1e8,local_170,pvVar21);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108);
      if (uVar19 < ((long)local_128.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_128.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
        if (bVar14) {
          writer::newline(this);
        }
        else {
          local_168._0_8_ = &local_158;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_168,", ","");
          std::__cxx11::string::_M_append((char *)this,local_168._0_8_);
LAB_0011375d:
          this->col = this->col + local_168._8_4_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._0_8_ != &local_158) {
            operator_delete((void *)local_168._0_8_);
          }
        }
      }
      else if (!bVar14) {
        local_168._0_8_ = &local_158;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_168," ","");
        std::__cxx11::string::_M_append((char *)this,local_168._0_8_);
        goto LAB_0011375d;
      }
      if (local_188 != (_Manager_type)0x0) {
        (*local_188)(&local_198,&local_198,__destroy_functor);
      }
      std::vector<lightconf::token,_std::allocator<lightconf::token>_>::~vector(&local_1c8);
      if (local_1e8 != (undefined1  [8])&local_1d8) {
        operator_delete((void *)local_1e8);
      }
      uVar19 = (ulong)((int)uVar19 + 1);
      pbVar26 = pbVar26 + 1;
    } while (pbVar26 != local_d0);
  }
  if (braces) {
    std::deque<int,_std::allocator<int>_>::pop_back(&(this->tabstops).c);
    if (bVar14) {
      writer::newline(this);
    }
    scanner::expect(local_e0,'}',false);
    local_1e8 = (undefined1  [8])&local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"}","");
    std::__cxx11::string::_M_append((char *)this,(ulong)local_1e8);
    this->col = this->col + (int)local_1e0;
    if (local_1e8 != (undefined1  [8])&local_1d8) {
      operator_delete((void *)local_1e8);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  return;
}

Assistant:

inline void write_group(scanner& sc, writer& wr, bool braces, const group& gr) {
    bool wrap = !braces || group_length(gr) > wr.wrap_length;

    if (braces) {
        wr.append("{ ");
        wr.indent();
        if (wrap) {
            wr.newline();
        }
        sc.expect('{');
    }

    std::vector<std::string> keys;
    for (const auto& key : gr) {
        keys.push_back(key);
    }

    while (sc.peek_token().type != token_type::eof_token && !(braces && sc.peek_token().is_char('}'))) {
        std::string key = sc.expect_identifier();
        sc.expect('=');

        auto key_it = std::find(std::begin(keys), std::end(keys), key);
        if (key_it != keys.end()) {
            wr.append(key);
            wr.append(" = ");
            write_value(sc, wr, gr.get<value>(*key_it));
            keys.erase(key_it);
            bool terminate = sc.peek_token().is_char('}') && keys.empty();
            if (!terminate) {
                if (wrap) {
                    wr.newline();
                } else {
                    wr.append(", ");
                }
            } else if (!wrap) {
                wr.append(" ");
            }
        } else {
            read_value(sc);
        }

        sc.expect(',', true);
        if (braces && sc.peek_token().is_char('}')) {
            break;
        }
    }

    unsigned int i = 0;
    for (const auto& key : keys) {
        wr.append(key);
        wr.append(" = ");
        scanner dummy_scanner = make_scanner("0");
        write_value(dummy_scanner, wr, gr.get<value>(key));
        if (i < keys.size() - 1) {
            if (wrap) {
                wr.newline();
            } else {
                wr.append(", ");
            }
        } else if (!wrap) {
            wr.append(" ");
        }
        i++;
    }

    if (braces) {
        wr.unindent();
        if (wrap) {
            wr.newline();
        }
        sc.expect('}');
        wr.append("}");
    }
}